

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

int compare_files(char *fn,char *fn2)

{
  int iVar1;
  ostream *poVar2;
  size_t __n;
  size_t sVar3;
  char *in_RSI;
  char *in_RDI;
  ssize_t b;
  ssize_t nr2;
  ssize_t nr1;
  size_t offset;
  size_t chunkReq;
  size_t toRead;
  uint8_t buf2 [512];
  uint8_t buf1 [512];
  int ret;
  int fd2;
  int fd1;
  stat sb2;
  stat sb1;
  long local_578;
  long local_560;
  long local_550;
  char local_548 [512];
  char local_348 [516];
  int local_144;
  int local_140;
  int local_13c;
  stat local_138;
  stat local_a8;
  char *local_18;
  char *local_10;
  
  local_13c = 0xffffffff;
  local_140 = 0xffffffff;
  local_144 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_13c = open(in_RDI,0);
  local_140 = open(local_18,0);
  if ((local_13c < 0) || (local_140 < 0)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to open \'");
    poVar2 = std::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (-1 < local_13c) {
      close(local_13c);
    }
    if (-1 < local_140) {
      close(local_140);
    }
    return -1;
  }
  iVar1 = fstat(local_13c,&local_a8);
  if ((iVar1 == 0) && (iVar1 = fstat(local_140,&local_138), iVar1 == 0)) {
    if (local_a8.st_size != local_138.st_size) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"File sizes do not match: \'");
      poVar2 = std::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2,"\' ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a8.st_size);
      poVar2 = std::operator<<(poVar2," \'");
      poVar2 = std::operator<<(poVar2,local_18);
      poVar2 = std::operator<<(poVar2,"\' ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_138.st_size);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      close(local_13c);
      close(local_140);
      return 1;
    }
    local_560 = 0;
    for (local_550 = local_a8.st_size; local_550 != 0; local_550 = local_550 - __n) {
      __n = read(local_13c,local_348,0x200);
      sVar3 = read(local_140,local_548,0x200);
      if (((long)__n < 0) || ((long)sVar3 < 0)) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to read from files ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,__n);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_144 = -1;
        break;
      }
      if (__n != sVar3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Mismatch in read amounts ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,__n);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_144 = -1;
        break;
      }
      if ((0 < (long)__n) && (iVar1 = memcmp(local_348,local_548,__n), iVar1 != 0)) {
        local_578 = 0;
        goto LAB_0011784b;
      }
      local_560 = __n + local_560;
    }
  }
LAB_00117930:
  close(local_13c);
  close(local_140);
  return local_144;
LAB_0011784b:
  if ((long)__n <= local_578) goto LAB_001178f9;
  if (local_348[local_578] != local_548[local_578]) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Files \'");
    poVar2 = std::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,"\' differ in chunk starting at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_560 + local_578);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    goto LAB_001178f9;
  }
  local_578 = local_578 + 1;
  goto LAB_0011784b;
LAB_001178f9:
  local_144 = -1;
  goto LAB_00117930;
}

Assistant:

static int
compare_files (const char* fn, const char* fn2)
{
    struct stat sb1, sb2;
    int fd1 = -1, fd2 = -1;
    int ret = 0;

    fd1 = open (fn, O_RDONLY);
    fd2 = open (fn2, O_RDONLY);
    if (fd1 >= 0 && fd2 >= 0)
    {
        if (0 == fstat (fd1, &sb1) && 0 == fstat (fd2, &sb2))
        {
            if (sb1.st_size != sb2.st_size)
            {
                std::cerr << "File sizes do not match: '" << fn << "' "
                          << sb1.st_size << " '" << fn2 << "' " << sb2.st_size
                          << std::endl;
                close (fd1);
                close (fd2);
                return 1;
            }

            uint8_t buf1[512], buf2[512];
            size_t  toRead   = sb1.st_size;
            size_t  chunkReq = sizeof (buf1);
            size_t  offset   = 0;
            while (toRead > 0)
            {
                ssize_t nr1 = read (fd1, buf1, chunkReq);
                ssize_t nr2 = read (fd2, buf2, chunkReq);
                if (nr1 < 0 || nr2 < 0)
                {
                    std::cerr << "Unable to read from files " << nr1 << ", "
                              << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 != nr2)
                {
                    std::cerr << "Mismatch in read amounts " << nr1 << ", "
                              << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 > 0)
                {
                    if (memcmp (buf1, buf2, nr1) != 0)
                    {
                        for (ssize_t b = 0; b < nr1; ++b)
                        {
                            if (buf1[b] != buf2[b])
                            {
                                std::cerr << "Files '" << fn << "' and '" << fn2
                                          << "' differ in chunk starting at "
                                          << offset + b << std::endl;
                                break;
                            }
                        }
                        ret = -1;
                        break;
                    }
                }
                offset += nr1;
                toRead -= nr1;
            }
        }
        close (fd1);
        close (fd2);
        return ret;
    }
    else
    {
        std::cerr << "Unable to open '" << fn << "' and '" << fn2 << "'"
                  << std::endl;
    }
    if (fd1 >= 0) close (fd1);
    if (fd2 >= 0) close (fd2);
    return -1;
}